

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O1

void func_call_by_ptr_arr(size_t COUNT)

{
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  size_t res;
  undefined8 local_38;
  double local_30;
  
  lVar4 = 0;
  do {
    iVar1 = rand();
    *(int *)((long)&arr[0].value + lVar4) = iVar1;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x8000000);
  lVar4 = std::chrono::_V2::system_clock::now();
  local_38 = 0;
  lVar5 = 0;
  do {
    (*(code *)(&PTR_f1_00108d30)[(int)local_38 + *(int *)((long)&arr[0].value + lVar5) & 7])
              (&local_38);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x8000000);
  lVar5 = std::chrono::_V2::system_clock::now();
  side_effect = side_effect + ((uint)local_38 & 1);
  dVar6 = (double)(lVar5 - lVar4) / 1000000000.0;
  dVar7 = dVar6 * 1000.0 * 1000.0 * 1000.0 * 5.9604644775390625e-08;
  local_30 = ((16777216.0 / dVar6) / 1000.0) / 1000.0;
  expand_name("func_call_by_ptr_arr");
  sVar2 = strlen(expand_name::buf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,expand_name::buf,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar3 = std::ostream::_M_insert<double>(dVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ns per operation,\t",0x12);
  poVar3 = std::ostream::_M_insert<double>(dVar7 / unit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ticks,\t",8);
  poVar3 = std::ostream::_M_insert<double>(local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Mrps",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

static void __attribute__((noinline))
func_call_by_ptr_arr(const size_t COUNT = SIZE)
{
    f_t f[8] = {f1, f2, f3, f4, f5, f6, f7, f8};
    for (uint32_t i = 0; i < COUNT; i++)
    {
        arr[i].value = rand();
    }

    now_t start = now();
    size_t res = 0;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        f[(res + arr[i].value) % 8](res);
    }
    now_t stop = now();
    side_effect += res % 2;

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}